

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLStringPool::flushAll(XMLStringPool *this)

{
  uint local_14;
  uint index;
  XMLStringPool *this_local;
  
  for (local_14 = 1; local_14 < this->fCurId; local_14 = local_14 + 1) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])
              (this->fMemoryManager,this->fIdMap[local_14]->fString);
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fIdMap[local_14]);
  }
  this->fCurId = 1;
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher>::removeAll
            (this->fHashTable);
  return;
}

Assistant:

void XMLStringPool::flushAll()
{
    // delete all buckelements, since the hashtable doesn't adopt the elements anymore
    for (unsigned int index = 1; index < fCurId; index++)
    {
        //fIdMap[index]->~PoolElem();                                // we have no destructor
        fMemoryManager->deallocate((void*) fIdMap[index]->fString);  // deallocate memory
        fMemoryManager->deallocate(fIdMap[index]);                   // deallocate memory
    }
    fCurId = 1;
    fHashTable->removeAll();
}